

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FieldMap *this_00;
  ResendRange RVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FieldBase *msgType;
  FieldBase *senderCompID;
  FieldBase *targetCompID;
  FieldBase *sendingTime;
  long *plVar6;
  undefined8 extraout_RAX;
  logic_error *this_01;
  size_type *psVar7;
  signed_int value;
  byte bVar8;
  byte local_154;
  FieldBase *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  undefined1 local_d0 [16];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  size_t local_a0;
  undefined8 uStack_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (FieldMap *)(ctx + 0x70);
  msgType = FieldMap::getFieldRef(this_00,0x23);
  senderCompID = FieldMap::getFieldRef(this_00,0x31);
  targetCompID = FieldMap::getFieldRef(this_00,0x38);
  sendingTime = FieldMap::getFieldRef(this_00,0x34);
  local_154 = (byte)siglen;
  bVar8 = (byte)sig | local_154;
  if (bVar8 == 1) {
    local_148 = FieldMap::getFieldRef(this_00,0x22);
  }
  else {
    local_148 = (FieldBase *)0x0;
  }
  bVar3 = validLogonState(this,(MsgType *)msgType);
  if (!bVar3) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"Logon state is not valid for message");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar3 = isGoodTime(this,(SendingTime *)sendingTime);
  if (!bVar3) {
    doBadTime(this,(Message *)ctx);
    return 0;
  }
  bVar3 = isCorrectCompID(this,(SenderCompID *)senderCompID,(TargetCompID *)targetCompID);
  if (!bVar3) {
    doBadCompID(this,(Message *)ctx);
    return 0;
  }
  if ((byte)sig == 0) {
    if (local_154 != 0) goto LAB_0019d51b;
    if (bVar8 == 0) goto LAB_0019d759;
  }
  else {
    iVar4 = IntField::getValue((IntField *)local_148);
    iVar5 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    if (iVar5 < iVar4) {
      doTargetTooHigh(this,(Message *)ctx);
      return 0;
    }
    if (local_154 != 0) {
LAB_0019d51b:
      iVar4 = IntField::getValue((IntField *)local_148);
      iVar5 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
      if (iVar4 < iVar5) {
        doTargetTooLow(this,(Message *)ctx);
        return 0;
      }
    }
  }
  if ((this->m_state).m_resendRange.second != 0 || (this->m_state).m_resendRange.first != 0) {
    RVar1 = (this->m_state).m_resendRange;
    iVar4 = IntField::getValue((IntField *)local_148);
    if (RVar1.second <= iVar4) {
      IntConvertor::convert_abi_cxx11_(&local_70,(IntConvertor *)((ulong)RVar1 & 0xffffffff),value);
      std::operator+(&local_50,"ResendRequest for messages FROM: ",&local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138.field_2._8_8_ = plVar6[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar7;
        local_138._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_138._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      IntConvertor::convert_abi_cxx11_
                (&local_90,(IntConvertor *)((ulong)RVar1 >> 0x20),
                 (signed_int)local_138._M_string_length);
      std::operator+(&local_118,&local_138,&local_90);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        aStack_e0._M_allocated_capacity = *psVar7;
        aStack_e0._8_8_ = plVar6[3];
        local_f0._0_8_ = local_f0 + 0x10;
      }
      else {
        aStack_e0._M_allocated_capacity = *psVar7;
        local_f0._0_8_ = (size_type *)*plVar6;
      }
      local_f0._8_8_ = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      SessionState::onEvent(&this->m_state,(string *)local_f0);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_,aStack_e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_118._M_dataplus._M_p._4_4_,(int)local_118._M_dataplus._M_p) !=
          &local_118.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_118._M_dataplus._M_p._4_4_,(int)local_118._M_dataplus._M_p),
                        local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      (this->m_state).m_resendRange.first = 0;
      (this->m_state).m_resendRange.second = 0;
    }
  }
LAB_0019d759:
  DateTime::nowUtc();
  local_118._M_dataplus._M_p._0_4_ = local_f0._8_4_;
  local_118._M_dataplus._M_p._4_4_ = local_f0._12_4_;
  local_118._M_string_length._0_4_ = aStack_e0._M_allocated_capacity._0_4_;
  local_118._M_string_length._4_4_ = aStack_e0._M_allocated_capacity._4_4_;
  (this->m_state).m_lastReceivedTime.super_DateTime.m_date = local_f0._8_4_;
  *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.field_0xc = local_f0._12_4_;
  *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time =
       aStack_e0._M_allocated_capacity._0_4_;
  *(undefined4 *)((long)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time + 4) =
       aStack_e0._M_allocated_capacity._4_4_;
  (this->m_state).m_testRequest = 0;
  local_f0._0_8_ = &PTR__FieldBase_001ea6e0;
  local_f0._8_4_ = msgType->m_tag;
  aStack_e0._M_allocated_capacity = (size_type)local_d0;
  pcVar2 = (msgType->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_f0 + 0x10),pcVar2,pcVar2 + (msgType->m_string)._M_string_length);
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0 = (msgType->m_metrics).m_length;
  uStack_98._0_4_ = (msgType->m_metrics).m_checksum;
  uStack_98._4_4_ = *(undefined4 *)&(msgType->m_metrics).field_0xc;
  local_f0._0_8_ = &PTR__FieldBase_001ea860;
  fromCallback(this,(MsgType *)local_f0,(Message *)ctx,(SessionID *)&PTR__FieldBase_001ea860);
  FieldBase::~FieldBase((FieldBase *)local_f0);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Session::verify( const Message& msg, bool checkTooHigh,
                      bool checkTooLow )
{
  const MsgType* pMsgType = 0;
  const MsgSeqNum* pMsgSeqNum = 0;

  try
  {
    const Header& header = msg.getHeader();

    pMsgType = FIELD_GET_PTR( header, MsgType );
    const SenderCompID& senderCompID = FIELD_GET_REF( header, SenderCompID );
    const TargetCompID& targetCompID = FIELD_GET_REF( header, TargetCompID );
    const SendingTime& sendingTime = FIELD_GET_REF( header, SendingTime );

    if( checkTooHigh || checkTooLow )
      pMsgSeqNum = FIELD_GET_PTR( header, MsgSeqNum );

    if ( !validLogonState( *pMsgType ) )
      throw std::logic_error( "Logon state is not valid for message" );

    if ( !isGoodTime( sendingTime ) )
    {
      doBadTime( msg );
      return false;
    }
    if ( !isCorrectCompID( senderCompID, targetCompID ) )
    {
      doBadCompID( msg );
      return false;
    }

    if ( checkTooHigh && isTargetTooHigh( *pMsgSeqNum ) )
    {
      doTargetTooHigh( msg );
      return false;
    }
    else if ( checkTooLow && isTargetTooLow( *pMsgSeqNum ) )
    {
      doTargetTooLow( msg );
      return false;
    }

    if ( (checkTooHigh || checkTooLow) && m_state.resendRequested() )
    {
      SessionState::ResendRange range = m_state.resendRange();
 
      if ( *pMsgSeqNum >= range.second )
      {
        m_state.onEvent ("ResendRequest for messages FROM: " +
                         IntConvertor::convert (range.first) + " TO: " +
                         IntConvertor::convert (range.second) +
                         " has been satisfied.");
        m_state.resendRange (0, 0);
      }
    }
  }
  catch ( std::exception& e )
  {
    m_state.onEvent( e.what() );
    disconnect();
    return false;
  }

  UtcTimeStamp now;
  m_state.lastReceivedTime( now );
  m_state.testRequest( 0 );

  fromCallback( pMsgType ? *pMsgType : MsgType(), msg, m_sessionID );
  return true;
}